

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyFlat
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix,uint segmentCount)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  Plausibility PVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  Reader RStack_48;
  
  pbVar8 = prefix.ptr;
  PVar6 = PLAUSIBLE;
  if (7 < prefix.size_) {
    bVar1 = *pbVar8;
    PVar6 = IMPOSSIBLE;
    if ((bVar1 & 3) == 0) {
      bVar2 = pbVar8[3];
      if (((-1 < (char)bVar2) ||
          ((((bVar1 == 0xff && (pbVar8[1] == 0xff)) && ((pbVar8[2] & bVar2) == 0xff)) &&
           (((pbVar8[4] == 0 && (pbVar8[5] == 0)) && ((pbVar8[6] == 0 && (pbVar8[7] == 0)))))))) &&
         (PVar6 = IMPLAUSIBLE, bVar2 < 0x20)) {
        uVar3 = *(ushort *)(pbVar8 + 4);
        uVar5 = *(ushort *)(pbVar8 + 6);
        if ((uint)uVar5 + (uint)uVar3 < 0x801) {
          Schema::getProto(&RStack_48,&(this->rootType).super_Schema);
          uVar4 = 0;
          if (0x7f < RStack_48._reader.dataSize) {
            uVar4 = *(ushort *)((long)RStack_48._reader.data + 0xe);
          }
          uVar9 = (uint)uVar5;
          if (uVar3 < uVar4) {
            uVar7 = 0;
            if (0xcf < RStack_48._reader.dataSize) {
              uVar7 = (uint)*(ushort *)((long)RStack_48._reader.data + 0x18);
            }
            if (uVar7 < uVar9) {
              return WRONG_TYPE;
            }
          }
          uVar5 = 0;
          if (0x7f < RStack_48._reader.dataSize) {
            uVar5 = *(ushort *)((long)RStack_48._reader.data + 0xe);
          }
          if (uVar5 < uVar3) {
            uVar7 = 0;
            if (0xcf < RStack_48._reader.dataSize) {
              uVar7 = (uint)*(ushort *)((long)RStack_48._reader.data + 0x18);
            }
            if (uVar9 < uVar7) {
              return WRONG_TYPE;
            }
          }
          uVar7 = 0;
          if (0x7f < RStack_48._reader.dataSize) {
            uVar7 = (uint)*(ushort *)((long)RStack_48._reader.data + 0xe);
          }
          if (uVar7 < uVar3) {
            uVar7 = 0;
            if (0x7f < RStack_48._reader.dataSize) {
              uVar7 = (uint)*(ushort *)((long)RStack_48._reader.data + 0xe);
            }
            if (0x80 < uVar3 - uVar7) {
              return WRONG_TYPE;
            }
          }
          uVar7 = 0;
          if (0xcf < RStack_48._reader.dataSize) {
            uVar7 = (uint)*(ushort *)((long)RStack_48._reader.data + 0x18);
          }
          if (uVar7 < uVar9) {
            uVar7 = 0;
            if (0xcf < RStack_48._reader.dataSize) {
              uVar7 = (uint)*(ushort *)((long)RStack_48._reader.data + 0x18);
            }
            if (0x80 < uVar9 - uVar7) {
              return WRONG_TYPE;
            }
          }
          PVar6 = PLAUSIBLE;
        }
        return PVar6;
      }
    }
    else {
      PVar6 = IMPOSSIBLE;
      if ((bVar1 & 3) == 2) {
        PVar6 = (uint)(*(uint *)(pbVar8 + 4) < segmentCount) * 3;
        if (*(uint *)(pbVar8 + 4) == 0) {
          PVar6 = IMPOSSIBLE;
        }
        return PVar6;
      }
    }
  }
  return PVar6;
}

Assistant:

Plausibility isPlausiblyFlat(kj::ArrayPtr<const byte> prefix, uint segmentCount = 1) {
    if (prefix.size() < 8) {
      // Not enough prefix to say.
      return PLAUSIBLE;
    }

    if ((prefix[0] & 3) == 2) {
      // Far pointer.  Verify the segment ID.
      uint32_t segmentId = prefix[4] | (prefix[5] << 8)
                         | (prefix[6] << 16) | (prefix[7] << 24);
      if (segmentId == 0 || segmentId >= segmentCount) {
        return IMPOSSIBLE;
      } else {
        return PLAUSIBLE;
      }
    }

    if ((prefix[0] & 3) != 0) {
      // Not a struct pointer.
      return IMPOSSIBLE;
    }
    if ((prefix[3] & 0x80) != 0) {
      if (prefix[0] == 0xff && prefix[1] == 0xff && prefix[2] == 0xff && prefix[3] == 0xff &&
          prefix[4] == 0    && prefix[5] == 0    && prefix[6] == 0    && prefix[7] == 0) {
        // This is an empty struct with offset of -1. That's valid.
      } else {
        // Offset is negative (invalid).
        return IMPOSSIBLE;
      }
    }
    if ((prefix[3] & 0xe0) != 0) {
      // Offset is over a gigabyte (implausible).
      return IMPLAUSIBLE;
    }

    uint data = prefix[4] | (prefix[5] << 8);
    uint pointers = prefix[6] | (prefix[7] << 8);

    if (data + pointers > 2048) {
      // Root struct is huge (over 16 KiB).
      return IMPLAUSIBLE;
    }

    auto structSchema = rootType.getProto().getStruct();
    if ((data < structSchema.getDataWordCount() && pointers > structSchema.getPointerCount()) ||
        (data > structSchema.getDataWordCount() && pointers < structSchema.getPointerCount())) {
      // Struct is neither older nor newer than the schema.
      return WRONG_TYPE;
    }

    if (data > structSchema.getDataWordCount() &&
        data - structSchema.getDataWordCount() > 128) {
      // Data section appears to have grown by 1k (128 words).  This seems implausible.
      return WRONG_TYPE;
    }
    if (pointers > structSchema.getPointerCount() &&
        pointers - structSchema.getPointerCount() > 128) {
      // Pointer section appears to have grown by 1k (128 words).  This seems implausible.
      return WRONG_TYPE;
    }

    return PLAUSIBLE;
  }